

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O1

void __thiscall ThreadConfiguration::ResetExperimentalFeaturesFromConfig(ThreadConfiguration *this)

{
  bool bVar1;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ESDynamicImportFlag);
  if (bVar1) {
    this->m_ESDynamicImport = (bool)DAT_015b0203;
  }
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ES6RegExPrototypePropertiesFlag)
  ;
  if (bVar1) {
    this->m_ES6RegExPrototypeProperties = (bool)DAT_015b021a;
  }
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ES6RegExSymbolsFlag);
  if (bVar1) {
    this->m_ES6RegExSymbols = (bool)DAT_015b021b;
  }
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ESSharedArrayBufferFlag);
  if (bVar1) {
    this->m_ESSharedArrayBuffer = (bool)DAT_015b021e;
  }
  return;
}

Assistant:

void ResetExperimentalFeaturesFromConfig()
    {
        // If a flag was overridden using config/command line it should take precedence
#define FLAG_REGOVR_EXP(type, name, ...) if(CONFIG_ISENABLED(Js::Flag::##name##Flag)) { m_##name## = CONFIG_FLAG_RELEASE(##name##); }
#include "ConfigFlagsList.h"
#undef FLAG_REGOVR_EXP
    }